

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

int hydro_pad(uchar *buf,size_t unpadded_buflen,size_t blocksize,size_t max_buflen)

{
  byte bVar1;
  ulong uVar2;
  uchar barrier_mask;
  uchar mask;
  size_t xpadded_len;
  size_t xpadlen;
  size_t i;
  uchar *tail;
  size_t max_buflen_local;
  size_t blocksize_local;
  size_t unpadded_buflen_local;
  uchar *buf_local;
  int local_4;
  
  if ((blocksize == 0) || (0x7fffffff < max_buflen)) {
    local_4 = -1;
  }
  else {
    if ((blocksize & blocksize - 1) == 0) {
      uVar2 = unpadded_buflen & blocksize - 1;
    }
    else {
      uVar2 = unpadded_buflen % blocksize;
    }
    xpadlen = (blocksize - 1) - uVar2;
    if (xpadlen < -unpadded_buflen - 1) {
      uVar2 = unpadded_buflen + xpadlen;
      if (uVar2 < max_buflen) {
        mask = '\0';
        for (i = 0; i < blocksize; i = i + 1) {
          bVar1 = (byte)((i ^ xpadlen) - 1 >> 0x38);
          buf[uVar2 - i] = buf[uVar2 - i] & mask | bVar1 & 0x80;
          mask = mask | bVar1;
        }
        local_4 = (int)uVar2 + 1;
      }
      else {
        local_4 = -1;
      }
    }
    else {
      local_4 = -1;
    }
  }
  return local_4;
}

Assistant:

int
hydro_pad(unsigned char *buf, size_t unpadded_buflen, size_t blocksize, size_t max_buflen)
{
    unsigned char         *tail;
    size_t                 i;
    size_t                 xpadlen;
    size_t                 xpadded_len;
    volatile unsigned char mask;
    unsigned char          barrier_mask;

    if (blocksize <= 0U || max_buflen > INT_MAX) {
        return -1;
    }
    xpadlen = blocksize - 1U;
    if ((blocksize & (blocksize - 1U)) == 0U) {
        xpadlen -= unpadded_buflen & (blocksize - 1U);
    } else {
        xpadlen -= unpadded_buflen % blocksize;
    }
    if ((size_t) SIZE_MAX - unpadded_buflen <= xpadlen) {
        return -1;
    }
    xpadded_len = unpadded_buflen + xpadlen;
    if (xpadded_len >= max_buflen) {
        return -1;
    }
    tail = &buf[xpadded_len];
    mask = 0U;
    for (i = 0; i < blocksize; i++) {
        barrier_mask = (unsigned char) (((i ^ xpadlen) - 1U) >> ((sizeof(size_t) - 1U) * CHAR_BIT));
        *(tail - i)  = ((*(tail - i)) & mask) | (0x80 & barrier_mask);
        mask |= barrier_mask;
    }
    return (int) (xpadded_len + 1);
}